

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# droplayer.cpp
# Opt level: O0

UINT8 __thiscall DROPlayer::Start(DROPlayer *this)

{
  UINT8 UVar1;
  size_type sVar2;
  reference cfg;
  size_t sVar3;
  reference pvVar4;
  byte *pbVar5;
  UINT32 local_6c;
  PLR_DEV_OPTS *local_68;
  reference pvStack_40;
  UINT8 resmplMode;
  VGM_BASEDEV *clDev;
  DEV_GEN_CFG *devCfg;
  PLR_DEV_OPTS *devOpts;
  DRO_CHIPDEV *cDev;
  ulong uStack_18;
  UINT8 retVal;
  size_t curDev;
  DROPlayer *this_local;
  
  for (uStack_18 = 0; uStack_18 < 3; uStack_18 = uStack_18 + 1) {
    this->_optDevMap[uStack_18] = 0xffffffffffffffff;
  }
  std::vector<DROPlayer::DRO_CHIPDEV,_std::allocator<DROPlayer::DRO_CHIPDEV>_>::clear
            (&this->_devices);
  sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->_devTypes);
  std::vector<DROPlayer::DRO_CHIPDEV,_std::allocator<DROPlayer::DRO_CHIPDEV>_>::resize
            (&this->_devices,sVar2);
  for (uStack_18 = 0;
      sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->_devTypes),
      uStack_18 < sVar2; uStack_18 = uStack_18 + 1) {
    pvStack_40 = std::vector<DROPlayer::DRO_CHIPDEV,_std::allocator<DROPlayer::DRO_CHIPDEV>_>::
                 operator[](&this->_devices,uStack_18);
    cfg = std::vector<_device_generic_config,_std::allocator<_device_generic_config>_>::operator[]
                    (&this->_devCfgs,uStack_18);
    (pvStack_40->base).defInf.dataPtr = (DEV_DATA *)0x0;
    (pvStack_40->base).linkDev = (VGM_BASEDEV *)0x0;
    sVar3 = DeviceID2OptionID(this,(UINT32)uStack_18);
    pvStack_40->optID = sVar3;
    if (pvStack_40->optID == 0xffffffffffffffff) {
      local_68 = (PLR_DEV_OPTS *)0x0;
    }
    else {
      local_68 = this->_devOpts + pvStack_40->optID;
    }
    if (local_68 == (PLR_DEV_OPTS *)0x0) {
      local_6c = 0;
    }
    else {
      local_6c = local_68->emuCore[0];
    }
    cfg->emuCore = local_6c;
    if (local_68 == (PLR_DEV_OPTS *)0x0) {
      UVar1 = '\0';
    }
    else {
      UVar1 = local_68->srMode;
    }
    cfg->srMode = UVar1;
    if ((local_68 == (PLR_DEV_OPTS *)0x0) || (local_68->smplRate == 0)) {
      cfg->smplRate = (this->super_PlayerBase)._outSmplRate;
    }
    else {
      cfg->smplRate = local_68->smplRate;
    }
    pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->_devTypes,uStack_18);
    UVar1 = SndEmu_Start(*pvVar4,cfg,(DEV_INFO *)pvStack_40);
    if (UVar1 == '\0') {
      SndEmu_GetDeviceFunc((pvStack_40->base).defInf.devDef,'\0','\x11',0,&pvStack_40->write);
      (pvStack_40->logCbData).player = this;
      (pvStack_40->logCbData).chipDevID = uStack_18;
      if (((pvStack_40->base).defInf.devDef)->SetLogCB != (DEVFUNC_SETLOGCB)0x0) {
        (*((pvStack_40->base).defInf.devDef)->SetLogCB)
                  ((pvStack_40->base).defInf.dataPtr,SndEmuLogCB,&pvStack_40->logCbData);
      }
      SetupLinkedDevices(&pvStack_40->base,(SETUPLINKDEV_CB)0x0,(void *)0x0);
      if (local_68 != (PLR_DEV_OPTS *)0x0) {
        if (((pvStack_40->base).defInf.devDef)->SetOptionBits != (DEVFUNC_OPTMASK)0x0) {
          (*((pvStack_40->base).defInf.devDef)->SetOptionBits)
                    ((pvStack_40->base).defInf.dataPtr,local_68->coreOpts);
        }
        this->_optDevMap[pvStack_40->optID] = uStack_18;
      }
      for (; pvStack_40 != (reference)0x0; pvStack_40 = (reference)(pvStack_40->base).linkDev) {
        if (local_68 == (PLR_DEV_OPTS *)0x0) {
          UVar1 = '\0';
        }
        else {
          UVar1 = local_68->resmplMode;
          if (((pvStack_40->base).defInf.devDef)->SetMuteMask != (DEVFUNC_OPTMASK)0x0) {
            (*((pvStack_40->base).defInf.devDef)->SetMuteMask)
                      ((pvStack_40->base).defInf.dataPtr,(local_68->muteOpts).chnMute[0]);
          }
        }
        Resmpl_SetVals(&(pvStack_40->base).resmpl,UVar1,0x100,(this->super_PlayerBase)._outSmplRate)
        ;
        pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (&this->_devPanning,uStack_18);
        if ((*pbVar5 & 2) != 0) {
          (pvStack_40->base).resmpl.volumeL = 0;
        }
        pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (&this->_devPanning,uStack_18);
        if ((*pbVar5 & 1) != 0) {
          (pvStack_40->base).resmpl.volumeR = 0;
        }
        Resmpl_DevConnect(&(pvStack_40->base).resmpl,(DEV_INFO *)pvStack_40);
        Resmpl_Init(&(pvStack_40->base).resmpl);
      }
    }
    else {
      (pvStack_40->base).defInf.dataPtr = (DEV_DATA *)0x0;
      (pvStack_40->base).defInf.devDef = (DEV_DEF *)0x0;
    }
  }
  this->_playState = this->_playState | 1;
  (*(this->super_PlayerBase)._vptr_PlayerBase[0x21])();
  if ((this->super_PlayerBase)._eventCbFunc != (PLAYER_EVENT_CB)0x0) {
    (*(this->super_PlayerBase)._eventCbFunc)
              (&this->super_PlayerBase,(this->super_PlayerBase)._eventCbParam,'\x01',(void *)0x0);
  }
  return '\0';
}

Assistant:

UINT8 DROPlayer::Start(void)
{
	size_t curDev;
	UINT8 retVal;
	
	for (curDev = 0; curDev < 3; curDev ++)
		_optDevMap[curDev] = (size_t)-1;
	
	_devices.clear();
	_devices.resize(_devTypes.size());
	for (curDev = 0; curDev < _devTypes.size(); curDev ++)
	{
		DRO_CHIPDEV* cDev = &_devices[curDev];
		PLR_DEV_OPTS* devOpts;
		DEV_GEN_CFG* devCfg = &_devCfgs[curDev];
		VGM_BASEDEV* clDev;
		
		cDev->base.defInf.dataPtr = NULL;
		cDev->base.linkDev = NULL;
		cDev->optID = DeviceID2OptionID((UINT32)curDev);
		
		devOpts = (cDev->optID != (size_t)-1) ? &_devOpts[cDev->optID] : NULL;
		devCfg->emuCore = (devOpts != NULL) ? devOpts->emuCore[0] : 0x00;
		devCfg->srMode = (devOpts != NULL) ? devOpts->srMode : DEVRI_SRMODE_NATIVE;
		if (devOpts != NULL && devOpts->smplRate)
			devCfg->smplRate = devOpts->smplRate;
		else
			devCfg->smplRate = _outSmplRate;
		
		retVal = SndEmu_Start(_devTypes[curDev], devCfg, &cDev->base.defInf);
		if (retVal)
		{
			cDev->base.defInf.dataPtr = NULL;
			cDev->base.defInf.devDef = NULL;
			continue;
		}
		SndEmu_GetDeviceFunc(cDev->base.defInf.devDef, RWF_REGISTER | RWF_WRITE, DEVRW_A8D8, 0, (void**)&cDev->write);
		
		cDev->logCbData.player = this;
		cDev->logCbData.chipDevID = curDev;
		if (cDev->base.defInf.devDef->SetLogCB != NULL)
			cDev->base.defInf.devDef->SetLogCB(cDev->base.defInf.dataPtr, DROPlayer::SndEmuLogCB, &cDev->logCbData);
		SetupLinkedDevices(&cDev->base, NULL, NULL);
		
		if (devOpts != NULL)
		{
			if (cDev->base.defInf.devDef->SetOptionBits != NULL)
				cDev->base.defInf.devDef->SetOptionBits(cDev->base.defInf.dataPtr, devOpts->coreOpts);
			
			_optDevMap[cDev->optID] = curDev;
		}
		
		for (clDev = &cDev->base; clDev != NULL; clDev = clDev->linkDev)
		{
			UINT8 resmplMode = (devOpts != NULL) ? devOpts->resmplMode : RSMODE_LINEAR;
			
			if (devOpts != NULL && clDev->defInf.devDef->SetMuteMask != NULL)
				clDev->defInf.devDef->SetMuteMask(clDev->defInf.dataPtr, devOpts->muteOpts.chnMute[0]);
			
			Resmpl_SetVals(&clDev->resmpl, resmplMode, 0x100, _outSmplRate);
			// do DualOPL2 hard panning by muting either the left or right speaker
			if (_devPanning[curDev] & 0x02)
				clDev->resmpl.volumeL = 0x00;
			if (_devPanning[curDev] & 0x01)
				clDev->resmpl.volumeR = 0x00;
			Resmpl_DevConnect(&clDev->resmpl, &clDev->defInf);
			Resmpl_Init(&clDev->resmpl);
		}
	}
	
	_playState |= PLAYSTATE_PLAY;
	Reset();
	if (_eventCbFunc != NULL)
		_eventCbFunc(this, _eventCbParam, PLREVT_START, NULL);
	
	return 0x00;
}